

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
agge::pod_vector<agge::tests::(anonymous_namespace)::A>::grow
          (pod_vector<agge::tests::(anonymous_namespace)::A> *this,count_t by)

{
  undefined1 auVar1 [16];
  count_t cVar2;
  count_t cVar3;
  uint uVar4;
  ulong uVar5;
  A *pAVar6;
  uint local_44;
  A *local_38;
  iterator i;
  A *p;
  A *buffer;
  count_t new_capacity;
  count_t size;
  count_t by_local;
  pod_vector<agge::tests::(anonymous_namespace)::A> *this_local;
  
  cVar2 = pod_vector<agge::tests::(anonymous_namespace)::A>::size(this);
  cVar3 = capacity(this);
  local_44 = by;
  if (by << 1 <= cVar3) {
    local_44 = cVar3 >> 1;
  }
  uVar4 = agge_max<unsigned_int>(local_44,1);
  auVar1 = ZEXT416(uVar4 + cVar3) * ZEXT816(4);
  uVar5 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pAVar6 = (A *)operator_new__(uVar5);
  local_38 = this->_begin;
  i = pAVar6;
  while (local_38 != this->_end) {
    i->a = local_38->a;
    local_38 = local_38 + 1;
    i = i + 1;
  }
  if (this->_begin != (A *)0x0) {
    operator_delete__(this->_begin);
  }
  this->_begin = pAVar6;
  this->_end = this->_begin + cVar2;
  this->_limit = this->_begin + (uVar4 + cVar3);
  return;
}

Assistant:

inline void pod_vector<T>::grow(count_t by)
	{
		count_t size = this->size(), new_capacity = capacity();

		new_capacity += agge_max(2 * by > new_capacity ? by : new_capacity / 2, 1u);

		T *buffer = new T[new_capacity], *p = buffer;
		
		for (iterator i = _begin; i != _end; )
			*p++ = *i++;
		delete []_begin;
		_begin = buffer;
		_end = _begin + size;
		_limit = _begin + new_capacity;
	}